

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::TestInfo::TestInfo
          (TestInfo *this,string *a_test_suite_name,string *a_name,char *a_type_param,
          char *a_value_param,CodeLocation *a_code_location,TypeId fixture_class_id,
          TestFactoryBase *factory)

{
  char *__s;
  string *__a;
  TestResult *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string *in_RSI;
  string *in_RDI;
  long in_R8;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  pointer in_stack_ffffffffffffff08;
  unique_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff10;
  allocator<char> *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff38;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff40;
  bool local_73;
  allocator<char> local_72;
  undefined1 local_71;
  TestResult *local_70;
  byte local_63;
  allocator<char> local_62;
  undefined1 local_61;
  char *local_60;
  allocator<char> local_41;
  undefined8 local_40;
  undefined8 local_38;
  long local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  std::__cxx11::string::string(in_RDI,in_RSI);
  local_38 = std::__cxx11::string::begin();
  local_40 = std::__cxx11::string::end();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
             in_stack_ffffffffffffff28);
  std::allocator<char>::~allocator(&local_41);
  local_61 = 0;
  local_63 = 0;
  if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    __s = (char *)0x0;
  }
  else {
    __s = (char *)operator_new(0x20);
    local_61 = 1;
    local_60 = __s;
    std::allocator<char>::allocator();
    local_63 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (local_20,in_stack_ffffffffffffff38._M_current,
               (allocator<char> *)in_stack_ffffffffffffff30);
    in_stack_ffffffffffffff40._M_current = (char *)local_20;
  }
  local_61 = 0;
  std::unique_ptr<std::__cxx11::string_const,std::default_delete<std::__cxx11::string_const>>::
  unique_ptr<std::default_delete<std::__cxx11::string_const>,void>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if ((local_63 & 1) != 0) {
    std::allocator<char>::~allocator(&local_62);
  }
  __a = in_RDI + 0x48;
  local_71 = 0;
  if (local_28 == 0) {
    this_00 = (TestResult *)0x0;
  }
  else {
    this_00 = (TestResult *)operator_new(0x20);
    local_71 = 1;
    local_70 = this_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff40._M_current,__s,(allocator<char> *)__a);
  }
  local_71 = 0;
  local_73 = local_28 != 0;
  std::unique_ptr<std::__cxx11::string_const,std::default_delete<std::__cxx11::string_const>>::
  unique_ptr<std::default_delete<std::__cxx11::string_const>,void>
            ((unique_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this_00,in_stack_ffffffffffffff08);
  if (local_73) {
    std::allocator<char>::~allocator(&local_72);
  }
  internal::CodeLocation::CodeLocation((CodeLocation *)this_00,(CodeLocation *)(in_RDI + 0x50));
  *(undefined8 *)(in_RDI + 0x78) = in_stack_00000008;
  in_RDI[0x80] = (string)0x0;
  in_RDI[0x81] = (string)0x0;
  in_RDI[0x82] = (string)0x0;
  in_RDI[0x83] = (string)0x0;
  *(undefined8 *)(in_RDI + 0x88) = in_stack_00000010;
  TestResult::TestResult(this_00);
  return;
}

Assistant:

TestInfo::TestInfo(const std::string& a_test_suite_name,
                   const std::string& a_name, const char* a_type_param,
                   const char* a_value_param,
                   internal::CodeLocation a_code_location,
                   internal::TypeId fixture_class_id,
                   internal::TestFactoryBase* factory)
    : test_suite_name_(a_test_suite_name),
      // begin()/end() is MSVC 17.3.3 ASAN crash workaround (GitHub issue #3997)
      name_(a_name.begin(), a_name.end()),
      type_param_(a_type_param ? new std::string(a_type_param) : nullptr),
      value_param_(a_value_param ? new std::string(a_value_param) : nullptr),
      location_(a_code_location),
      fixture_class_id_(fixture_class_id),
      should_run_(false),
      is_disabled_(false),
      matches_filter_(false),
      is_in_another_shard_(false),
      factory_(factory),
      result_() {}